

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquery.cpp
# Opt level: O1

void qInit(QSqlQuery *q,QString *query,QSqlDatabase *db)

{
  QSqlDatabase QVar1;
  bool bVar2;
  QSqlDriver *pQVar3;
  QSqlResult *result;
  long in_FS_OFFSET;
  QSqlQuery moved;
  QSqlDatabase database;
  QString local_50;
  QSqlDatabase local_38;
  QSqlDatabase local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d = (QSqlDatabasePrivate *)0xaaaaaaaaaaaaaaaa;
  QSqlDatabase::QSqlDatabase(&local_30,db);
  bVar2 = QSqlDatabase::isValid(&local_30);
  if (!bVar2) {
    local_50.d.d = (Data *)0x0;
    local_50.d.ptr = L"qt_sql_default_connection";
    local_50.d.size = 0x19;
    QSqlDatabase::database(&local_38,&local_50,false);
    QSqlDatabase::operator=(&local_30,&local_38);
    QSqlDatabase::~QSqlDatabase(&local_38);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  bVar2 = QSqlDatabase::isValid(&local_30);
  if (bVar2) {
    pQVar3 = QSqlDatabase::driver(&local_30);
    result = (QSqlResult *)(**(code **)(*(long *)pQVar3 + 200))(pQVar3);
    QSqlQuery::QSqlQuery((QSqlQuery *)&local_38,result);
    QVar1.d = local_38.d;
    local_38.d = (QSqlDatabasePrivate *)0x0;
    local_50.d.d = (Data *)q->d;
    q->d = (QSqlQueryPrivate *)QVar1.d;
    QSqlQuery::~QSqlQuery((QSqlQuery *)&local_50);
    QSqlQuery::~QSqlQuery((QSqlQuery *)&local_38);
  }
  if ((query->d).size != 0) {
    QSqlQuery::exec(q,query);
  }
  QSqlDatabase::~QSqlDatabase(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qInit(QSqlQuery *q, const QString& query, const QSqlDatabase &db)
{
    QSqlDatabase database = db;
    if (!database.isValid()) {
        database =
                QSqlDatabase::database(QSqlDatabase::defaultConnectionName(), false);
    }
    if (database.isValid())
        *q = QSqlQuery(database.driver()->createResult());

    if (!query.isEmpty())
        q->exec(query);
}